

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_cross_entropy_loss_back(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,ggml_tensor *c)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  ggml_tensor *in_RCX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  ggml_tensor *in_stack_ffffffffffffffd8;
  
  _Var1 = ggml_is_scalar(in_RSI);
  if (!_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x13fd,"GGML_ASSERT(%s) failed","ggml_is_scalar(a)");
  }
  _Var1 = ggml_are_same_shape(in_RDX,in_RCX);
  if (!_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x13fe,"GGML_ASSERT(%s) failed","ggml_are_same_shape(b, c)");
  }
  pgVar2 = ggml_dup_tensor((ggml_context *)in_RCX,in_stack_ffffffffffffffd8);
  pgVar2->op = GGML_OP_CROSS_ENTROPY_LOSS_BACK;
  pgVar2->src[0] = in_RSI;
  pgVar2->src[1] = in_RDX;
  pgVar2->src[2] = in_RCX;
  return pgVar2;
}

Assistant:

struct ggml_tensor * ggml_cross_entropy_loss_back(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        struct ggml_tensor  * c) {
    GGML_ASSERT(ggml_is_scalar(a));
    GGML_ASSERT(ggml_are_same_shape(b, c));

    struct ggml_tensor * result = ggml_dup_tensor(ctx, b);

    result->op     = GGML_OP_CROSS_ENTROPY_LOSS_BACK;
    result->src[0] = a;
    result->src[1] = b;
    result->src[2] = c;

    return result;
}